

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict1 *caseDef)

{
  VkRenderPass renderPass_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  VkImageSubresourceRange subresourceRange;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)17>_> data_05;
  RefData<vk::Handle<(vk::HandleType)14>_> data_06;
  RefData<vk::Handle<(vk::HandleType)14>_> data_07;
  RefData<vk::Handle<(vk::HandleType)24>_> data_08;
  RefData<vk::VkCommandBuffer_s_*> data_09;
  RefData<vk::Handle<(vk::HandleType)8>_> data_10;
  RefData<vk::Handle<(vk::HandleType)9>_> data_11;
  RefData<vk::Handle<(vk::HandleType)9>_> data_12;
  RefData<vk::Handle<(vk::HandleType)23>_> data_13;
  VkImageViewType viewType;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  VkImageType VVar9;
  deUint32 height;
  deUint32 dVar10;
  VkResult result;
  MovePtr *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  Handle<(vk::HandleType)8> *pHVar11;
  ProgramCollection<vk::ProgramBinary> *pPVar12;
  ProgramBinary *pPVar13;
  Handle<(vk::HandleType)24> *pHVar14;
  Allocation *pAVar15;
  void *pvVar16;
  const_reference src;
  VkDeviceSize VVar17;
  Handle<(vk::HandleType)9> *pHVar18;
  reference this;
  RefBase<vk::Handle<(vk::HandleType)13>_> *this_00;
  Handle<(vk::HandleType)13> *__x;
  Handle<(vk::HandleType)16> *pHVar19;
  Handle<(vk::HandleType)17> *pHVar20;
  Handle<(vk::HandleType)14> *pHVar21;
  reference pAttachments;
  VkCommandBuffer_s **ppVVar22;
  Handle<(vk::HandleType)23> *pHVar23;
  reference this_01;
  RefBase<vk::Handle<(vk::HandleType)18>_> *this_02;
  Handle<(vk::HandleType)18> *pHVar24;
  TestContext *this_03;
  TestLog *log;
  MovePtr *pMVar25;
  IVec3 *this_04;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  Handle<(vk::HandleType)9> *local_d80;
  Handle<(vk::HandleType)9> *local_d70;
  Handle<(vk::HandleType)9> *local_d50;
  Handle<(vk::HandleType)9> *local_cf0;
  VkImageViewType local_c14;
  allocator<char> local_b51;
  string local_b50;
  uint local_b30;
  allocator<char> local_b29;
  string local_b28;
  Vector<unsigned_int,_4> local_b08;
  undefined1 local_af8 [8];
  ConstPixelBufferAccess resultImage;
  PixelBufferAccess expectedImage;
  TextureLevel textureLevel;
  TextureFormat TStack_a78;
  int depth;
  TextureFormat format;
  undefined4 local_a68 [2];
  VkBufferMemoryBarrier bufferBarriers [1];
  undefined8 local_a00;
  VkBufferImageCopy region_1;
  VkImageMemoryBarrier imageBarriers_1 [1];
  undefined1 local_93c [8];
  VkImageResolve region;
  VkImageMemoryBarrier imageBarriers [2];
  uint local_854;
  undefined8 uStack_850;
  deUint32 layerNdx_1;
  VkDeviceSize vertexBufferOffset;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkImageMemoryBarrier imageClearBarriers [1];
  undefined8 local_79c;
  VkClearColorValue clearColor;
  VkImageSubresourceRange ranges;
  VkImageMemoryBarrier imageLayoutBarriers [1];
  Move<vk::Handle<(vk::HandleType)23>_> local_720;
  RefData<vk::Handle<(vk::HandleType)23>_> local_700;
  Vector<int,_3> local_6dc;
  VkShaderModule local_6d0;
  VkShaderModule local_6c8;
  VkRenderPass local_6c0;
  VkPipelineLayout local_6b8;
  Move<vk::Handle<(vk::HandleType)18>_> local_6b0;
  value_type local_690;
  VkImageSubresourceRange local_680;
  VkImage local_668;
  Move<vk::Handle<(vk::HandleType)13>_> local_660;
  value_type local_640;
  uint local_630;
  deUint32 local_62c;
  deUint32 layerNdx;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_620;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_610;
  Move<vk::Handle<(vk::HandleType)9>_> local_600;
  RefData<vk::Handle<(vk::HandleType)9>_> local_5e0;
  undefined4 local_5c0;
  deUint32 local_5bc;
  VkImageUsageFlags msImageUsage;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_5b0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_5a0;
  Move<vk::Handle<(vk::HandleType)9>_> local_590;
  RefData<vk::Handle<(vk::HandleType)9>_> local_570;
  undefined4 local_54c;
  VkDeviceMemory VStack_548;
  VkImageUsageFlags colorImageUsage;
  deUint32 local_53c;
  deUint64 local_538;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_530;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_520;
  Move<vk::Handle<(vk::HandleType)8>_> local_510;
  RefData<vk::Handle<(vk::HandleType)8>_> local_4f0;
  VkDeviceSize local_4d0;
  VkDeviceSize vertexBufferSize;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VkImageViewType imageViewType;
  Move<vk::VkCommandBuffer_s_*> local_4a0;
  RefData<vk::VkCommandBuffer_s_*> local_480;
  undefined1 local_460 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_420;
  undefined1 local_400 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  string local_3d8;
  Move<vk::Handle<(vk::HandleType)14>_> local_3b8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_398;
  undefined1 local_378 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_350;
  Move<vk::Handle<(vk::HandleType)14>_> local_330;
  RefData<vk::Handle<(vk::HandleType)14>_> local_310;
  undefined1 local_2f0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_290;
  undefined1 local_270 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  RefData<vk::Handle<(vk::HandleType)16>_> local_218;
  undefined1 local_1f8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_168;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_158;
  undefined1 local_148 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_118;
  undefined1 local_f8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  VkDeviceSize colorBufferSize;
  deUint32 att_size_z;
  deUint32 att_size_y;
  deUint32 att_size_x;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> msColorImageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> msColorImage;
  undefined1 local_78 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  CaseDef_conflict1 *caseDef_local;
  Context *context_local;
  
  vk_00 = (MovePtr *)Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  dVar4 = Context::getUniversalQueueFamilyIndex(context);
  allocator_00 = Context::getDefaultAllocator(context);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &msColorImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&att_size_y);
  this_04 = &caseDef->attachmentSize;
  iVar5 = tcu::Vector<int,_3>::x(this_04);
  iVar6 = tcu::Vector<int,_3>::y(this_04);
  iVar7 = tcu::Vector<int,_3>::z(this_04);
  dVar10 = caseDef->numLayers;
  colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar8 = tcu::getPixelSize((TextureFormat)
                            colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
                            .m_allocator);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
             &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.field_0x8,(DeviceInterface *)vk_00,device_00,
             (ulong)(iVar5 * iVar6 * iVar7 * dVar10 * iVar8),2);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_118,
             (Move *)&colorBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar26 = (undefined4)local_118.object.m_internal;
  uVar27 = (undefined4)(local_118.object.m_internal >> 0x20);
  uVar28 = SUB84(local_118.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_118.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_deviceIface._0_4_ = uVar28;
  data_03.object.m_internal = local_118.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = uVar29;
  data_03.deleter.m_device._0_4_ = (int)local_118.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_118.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_118.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_118.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_f8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.field_0x8);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_f8);
  pMVar25 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_168,
             (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)pHVar11->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_158 = de::details::MovePtr::operator_cast_to_PtrData(&local_168,pMVar25);
  data.ptr._4_4_ = uVar27;
  data.ptr._0_4_ = uVar26;
  data._8_4_ = uVar28;
  data._12_4_ = uVar29;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_148,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_168);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &colorAttachments.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)&attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator)
  ;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)
                     &pipeline.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk_00,
                     device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_218,
             (Move *)&pipeline.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_218.deleter.m_deviceIface;
  data_04.object.m_internal = local_218.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_218.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_218.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_218.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_218.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_218.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_1f8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &pipeline.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator)
  ;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,(DeviceInterface *)vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM,
                 caseDef->numLayers,(bool)(caseDef->multisample & 1));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_290,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_290.deleter.m_deviceIface;
  data_05.object.m_internal = local_290.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_290.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_290.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_290.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_290.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_290.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_270,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
            );
  pPVar12 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"vert",
             (allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_350);
  ::vk::createShaderModule(&local_330,(DeviceInterface *)vk_00,device_00,pPVar13,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_310,(Move *)&local_330);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_310.deleter.m_deviceIface;
  data_06.object.m_internal = local_310.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_310.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_310.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_310.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_310.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_310.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2f0,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar12 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"frag",
             (allocator<char> *)
             ((long)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_3d8);
  ::vk::createShaderModule(&local_3b8,(DeviceInterface *)vk_00,device_00,pPVar13,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_398,(Move *)&local_3b8);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_398.deleter.m_deviceIface;
  data_07.object.m_internal = local_398.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_398.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_398.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_398.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_398.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_398.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_378,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator + 7));
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (DeviceInterface *)vk_00,device_00,2,dVar4,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_420,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_420.deleter.m_deviceIface;
  data_08.object.m_internal = local_420.object.m_internal;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_420.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device._0_4_ = (int)local_420.deleter.m_device;
  data_08.deleter.m_device._4_4_ = (int)((ulong)local_420.deleter.m_device >> 0x20);
  data_08.deleter.m_allocator._0_4_ = (int)local_420.deleter.m_allocator;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_420.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_400,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_400);
  makeCommandBuffer(&local_4a0,(DeviceInterface *)vk_00,device_00,(VkCommandPool)pHVar14->m_internal
                   );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_480,(Move *)&local_4a0);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_480.deleter.m_deviceIface;
  data_09.object = local_480.object;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_480.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device._0_4_ = (int)local_480.deleter.m_device;
  data_09.deleter.m_device._4_4_ = (int)((ulong)local_480.deleter.m_device >> 0x20);
  data_09.deleter.m_pool.m_internal._0_4_ = (int)local_480.deleter.m_pool.m_internal;
  data_09.deleter.m_pool.m_internal._4_4_ = (int)(local_480.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_460,data_09);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_4a0);
  if ((caseDef->imageType == VK_IMAGE_VIEW_TYPE_CUBE) ||
     (caseDef->imageType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
    local_c14 = VK_IMAGE_VIEW_TYPE_2D;
  }
  else {
    local_c14 = caseDef->imageType;
  }
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_c14;
  genFullQuadVertices((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      &vertexBufferSize,caseDef->numLayers);
  local_4d0 = pipeline::(anonymous_namespace)::sizeInBytes<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &vertexBufferSize);
  makeBuffer(&local_510,(DeviceInterface *)vk_00,device_00,local_4d0,0x80);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4f0,(Move *)&local_510);
  uVar26 = (undefined4)local_4f0.object.m_internal;
  uVar27 = (undefined4)(local_4f0.object.m_internal >> 0x20);
  uVar28 = SUB84(local_4f0.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_4f0.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_deviceIface._0_4_ = uVar28;
  data_10.object.m_internal = local_4f0.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = uVar29;
  data_10.deleter.m_device._0_4_ = (int)local_4f0.deleter.m_device;
  data_10.deleter.m_device._4_4_ = (int)((ulong)local_4f0.deleter.m_device >> 0x20);
  data_10.deleter.m_allocator._0_4_ = (int)local_4f0.deleter.m_allocator;
  data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_4f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_510);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &vertexBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  local_538 = pHVar11->m_internal;
  local_53c = ::vk::MemoryRequirement::HostVisible.m_flags;
  pMVar25 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_530,
             (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)local_538,
             ::vk::MemoryRequirement::HostVisible);
  local_520 = de::details::MovePtr::operator_cast_to_PtrData(&local_530,pMVar25);
  data_00.ptr._4_4_ = uVar27;
  data_00.ptr._0_4_ = uVar26;
  data_00._8_4_ = uVar28;
  data_00._12_4_ = uVar29;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &colorAttachments.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_530);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &colorAttachments.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar16 = ::vk::Allocation::getHostPtr(pAVar15);
  src = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &vertexBufferSize,0);
  ::deMemcpy(pvVar16,src,local_4d0);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &colorAttachments.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  VStack_548 = ::vk::Allocation::getMemory(pAVar15);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &colorAttachments.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  VVar17 = ::vk::Allocation::getOffset(pAVar15);
  ::vk::flushMappedMemoryRange((DeviceInterface *)vk_00,device_00,VStack_548,VVar17,local_4d0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &vertexBufferSize);
  local_54c = 0x13;
  VVar9 = getImageType(caseDef->imageType);
  makeImage(&local_590,(DeviceInterface *)vk_00,device_00,0,VVar9,VK_FORMAT_R8G8B8A8_UNORM,
            &caseDef->attachmentSize,caseDef->numLayers,0x13,false);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_570,(Move *)&local_590);
  uVar26 = (undefined4)local_570.object.m_internal;
  uVar27 = (undefined4)(local_570.object.m_internal >> 0x20);
  uVar28 = SUB84(local_570.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_570.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_deviceIface._0_4_ = uVar28;
  data_11.object.m_internal = local_570.object.m_internal;
  data_11.deleter.m_deviceIface._4_4_ = uVar29;
  data_11.deleter.m_device._0_4_ = (int)local_570.deleter.m_device;
  data_11.deleter.m_device._4_4_ = (int)((ulong)local_570.deleter.m_device >> 0x20);
  data_11.deleter.m_allocator._0_4_ = (int)local_570.deleter.m_allocator;
  data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_570.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_590);
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &colorImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  _msImageUsage = pHVar18->m_internal;
  local_5bc = ::vk::MemoryRequirement::Any.m_flags;
  pMVar25 = vk_00;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_5b0,
            (DeviceInterface *)vk_00,device_00,allocator_00,_msImageUsage,
            ::vk::MemoryRequirement::Any);
  local_5a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_5b0,pMVar25);
  data_01.ptr._4_4_ = uVar27;
  data_01.ptr._0_4_ = uVar26;
  data_01._8_4_ = uVar28;
  data_01._12_4_ = uVar29;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_5b0);
  if ((caseDef->multisample & 1U) != 0) {
    local_5c0 = 0x13;
    VVar9 = getImageType(caseDef->imageType);
    makeImage(&local_600,(DeviceInterface *)vk_00,device_00,0,VVar9,VK_FORMAT_R8G8B8A8_UNORM,
              &caseDef->attachmentSize,caseDef->numLayers,0x13,true);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_5e0,(Move *)&local_600);
    uVar26 = (undefined4)local_5e0.object.m_internal;
    uVar27 = (undefined4)(local_5e0.object.m_internal >> 0x20);
    uVar28 = SUB84(local_5e0.deleter.m_deviceIface,0);
    uVar29 = (undefined4)((ulong)local_5e0.deleter.m_deviceIface >> 0x20);
    data_12.deleter.m_deviceIface._0_4_ = uVar28;
    data_12.object.m_internal = local_5e0.object.m_internal;
    data_12.deleter.m_deviceIface._4_4_ = uVar29;
    data_12.deleter.m_device._0_4_ = (int)local_5e0.deleter.m_device;
    data_12.deleter.m_device._4_4_ = (int)((ulong)local_5e0.deleter.m_device >> 0x20);
    data_12.deleter.m_allocator._0_4_ = (int)local_5e0.deleter.m_allocator;
    data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_5e0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &msColorImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,data_12);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_600);
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &msColorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    _layerNdx = pHVar18->m_internal;
    local_62c = ::vk::MemoryRequirement::Any.m_flags;
    pMVar25 = vk_00;
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_620,
              (DeviceInterface *)vk_00,device_00,allocator_00,_layerNdx,::vk::MemoryRequirement::Any
             );
    local_610 = de::details::MovePtr::operator_cast_to_PtrData(&local_620,pMVar25);
    data_02.ptr._4_4_ = uVar27;
    data_02.ptr._0_4_ = uVar26;
    data_02._8_4_ = uVar28;
    data_02._12_4_ = uVar29;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&att_size_y,data_02);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_620);
  }
  for (local_630 = 0; local_630 < caseDef->numLayers; local_630 = local_630 + 1) {
    if ((caseDef->multisample & 1U) == 0) {
      local_cf0 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                             &colorImageAlloc.
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.field_0x8);
    }
    else {
      local_cf0 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                             &msColorImageAlloc.
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.field_0x8);
    }
    viewType = vertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_668.m_internal = local_cf0->m_internal;
    makeColorSubresourceRange(&local_680,local_630,1);
    subresourceRange.levelCount = local_680.levelCount;
    subresourceRange.aspectMask = local_680.aspectMask;
    subresourceRange.baseMipLevel = local_680.baseMipLevel;
    subresourceRange.baseArrayLayer = local_680.baseArrayLayer;
    subresourceRange.layerCount = local_680.layerCount;
    makeImageView(&local_660,(DeviceInterface *)vk_00,device_00,local_668,viewType,
                  VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
              ((_anonymous_namespace_ *)&local_640,&local_660);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 *)&attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_640);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_640);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_660);
    this = std::
           vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   *)&attachmentHandles.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (this)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    __x = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(this_00);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,__x);
    pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_1f8);
    local_6b8.m_internal = pHVar19->m_internal;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_270);
    local_6c0.m_internal = pHVar20->m_internal;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_2f0);
    local_6c8.m_internal = pHVar21->m_internal;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_378);
    local_6d0.m_internal = pHVar21->m_internal;
    tcu::Vector<int,_3>::Vector(&local_6dc,&caseDef->renderSize);
    makeGraphicsPipeline
              (&local_6b0,(DeviceInterface *)vk_00,device_00,local_6b8,local_6c0,local_6c8,local_6d0
               ,&local_6dc,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,local_630,true,
               (bool)(caseDef->multisample & 1));
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
              ((_anonymous_namespace_ *)&local_690,&local_6b0);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                    m_allocator,&local_690);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_690);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_6b0);
  }
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_270);
  renderPass_00.m_internal = pHVar20->m_internal;
  dVar10 = caseDef->numLayers;
  pAttachments = std::
                 vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                               *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                                  m_data.deleter.m_allocator,0);
  dVar4 = tcu::Vector<int,_3>::x(&caseDef->renderSize);
  height = tcu::Vector<int,_3>::y(&caseDef->renderSize);
  makeFramebuffer(&local_720,(DeviceInterface *)vk_00,device_00,renderPass_00,dVar10,pAttachments,
                  dVar4,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_700,(Move *)&local_720);
  data_13.deleter.m_deviceIface._0_4_ = (int)local_700.deleter.m_deviceIface;
  data_13.object.m_internal = local_700.object.m_internal;
  data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_700.deleter.m_deviceIface >> 0x20);
  data_13.deleter.m_device._0_4_ = (int)local_700.deleter.m_device;
  data_13.deleter.m_device._4_4_ = (int)((ulong)local_700.deleter.m_device >> 0x20);
  data_13.deleter.m_allocator._0_4_ = (int)local_700.deleter.m_allocator;
  data_13.deleter.m_allocator._4_4_ = (int)((ulong)local_700.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
             ,data_13);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_720);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar22);
  ranges.baseArrayLayer = 0x2d;
  imageLayoutBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageLayoutBarriers[0]._4_4_ = 0;
  imageLayoutBarriers[0].pNext._0_4_ = 0;
  imageLayoutBarriers[0].pNext._4_4_ = 0x1000;
  imageLayoutBarriers[0].srcAccessMask = 0;
  imageLayoutBarriers[0].dstAccessMask = 7;
  imageLayoutBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageLayoutBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  if ((caseDef->multisample & 1U) == 0) {
    local_d50 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &colorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
  }
  else {
    local_d50 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &msColorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
  }
  imageLayoutBarriers[0]._32_8_ = local_d50->m_internal;
  makeColorSubresourceRange
            ((VkImageSubresourceRange *)&imageLayoutBarriers[0].image,0,caseDef->numLayers);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar22,1,0x8000,0,0,0,0,0,1,&ranges.baseArrayLayer);
  makeColorSubresourceRange
            ((VkImageSubresourceRange *)(clearColor.float32 + 2),0,caseDef->numLayers);
  local_79c = 0;
  clearColor._0_8_ = 0x3f80000000000000;
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  pVVar1 = *ppVVar22;
  if ((caseDef->multisample & 1U) == 0) {
    local_d70 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &colorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
  }
  else {
    local_d70 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &msColorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
  }
  (*(*(_func_int ***)vk_00)[0x66])
            (vk_00,pVVar1,local_d70->m_internal,7,&local_79c,1,(int)((long)&clearColor + 8));
  renderArea.extent.width = 0x2d;
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageClearBarriers[0]._4_4_ = 0;
  imageClearBarriers[0].pNext._0_4_ = 0x1000;
  imageClearBarriers[0].pNext._4_4_ = 0x80;
  imageClearBarriers[0].srcAccessMask = 7;
  imageClearBarriers[0].dstAccessMask = 1;
  imageClearBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageClearBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  if ((caseDef->multisample & 1U) == 0) {
    local_d80 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &colorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
  }
  else {
    local_d80 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &msColorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
  }
  imageClearBarriers[0]._32_8_ = local_d80->m_internal;
  makeColorSubresourceRange
            ((VkImageSubresourceRange *)&imageClearBarriers[0].image,0,caseDef->numLayers);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar22,0x1000,0x80,0,0,0,0,0,1,&renderArea.extent);
  renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
  dVar10 = tcu::Vector<int,_3>::x(&caseDef->renderSize);
  dVar4 = tcu::Vector<int,_3>::y(&caseDef->renderSize);
  renderArea.offset = (VkOffset2D)::vk::makeExtent2D(dVar10,dVar4);
  vertexBufferOffset._0_4_ = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_270);
  renderPassBeginInfo.pNext = (void *)pHVar20->m_internal;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)
                       &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator);
  renderPassBeginInfo.renderPass.m_internal = pHVar23->m_internal;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.offset = renderArea.offset;
  renderPassBeginInfo.renderArea.extent.width = 0;
  renderPassBeginInfo.clearValueCount = 0;
  renderPassBeginInfo._52_4_ = 0;
  uStack_850 = 0;
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  (*(*(_func_int ***)vk_00)[0x74])(vk_00,*ppVVar22,&vertexBufferOffset,0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  pVVar1 = *ppVVar22;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &vertexBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  (*(*(_func_int ***)vk_00)[0x58])(vk_00,pVVar1,0,1,pHVar11,&stack0xfffffffffffff7b0);
  for (local_854 = 0; local_854 < caseDef->numLayers; local_854 = local_854 + 1) {
    if (local_854 != 0) {
      ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
      (*(*(_func_int ***)vk_00)[0x75])(vk_00,*ppVVar22,0);
    }
    ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
    pVVar1 = *ppVVar22;
    this_01 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                               deleter.m_allocator,(ulong)local_854);
    this_02 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                         (this_01)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(this_02);
    (*(*(_func_int ***)vk_00)[0x4c])(vk_00,pVVar1,0,pHVar24->m_internal);
    ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
    (*(*(_func_int ***)vk_00)[0x59])(vk_00,*ppVVar22,4,1,(ulong)(local_854 << 2));
  }
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  (*(*(_func_int ***)vk_00)[0x76])();
  if ((caseDef->multisample & 1U) != 0) {
    region.extent.height = 0x2d;
    imageBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageBarriers[0]._4_4_ = 0;
    imageBarriers[0].pNext._0_4_ = 0x100;
    imageBarriers[0].pNext._4_4_ = 0x800;
    imageBarriers[0].srcAccessMask = 2;
    imageBarriers[0].dstAccessMask = 1;
    imageBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    imageBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &msColorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    imageBarriers[0]._32_8_ = pHVar18->m_internal;
    makeColorSubresourceRange
              ((VkImageSubresourceRange *)&imageBarriers[0].image,0,caseDef->numLayers);
    imageBarriers[0].subresourceRange.layerCount = 0x2d;
    imageBarriers[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageBarriers[1]._4_4_ = 0;
    imageBarriers[1].pNext._0_4_ = 0;
    imageBarriers[1].pNext._4_4_ = 0x1000;
    imageBarriers[1].srcAccessMask = 0;
    imageBarriers[1].dstAccessMask = 1;
    imageBarriers[1].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    imageBarriers[1].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &colorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    imageBarriers[1]._32_8_ = pHVar18->m_internal;
    makeColorSubresourceRange
              ((VkImageSubresourceRange *)&imageBarriers[1].image,0,caseDef->numLayers);
    ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
    (*(*(_func_int ***)vk_00)[0x6d])
              (vk_00,*ppVVar22,0x8000,0x8000,0,0,0,0,0,2,&region.extent.height);
    _local_93c = ::vk::makeImageSubresourceLayers(1,0,0,caseDef->numLayers);
    region._8_12_ = ::vk::makeOffset3D(0,0,0);
    region._20_16_ = ::vk::makeImageSubresourceLayers(1,0,0,caseDef->numLayers);
    region._36_12_ = ::vk::makeOffset3D(0,0,0);
    region._48_12_ = ::vk::makeExtent3D(&caseDef->attachmentSize);
    ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
    pVVar1 = *ppVVar22;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &msColorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    dVar2 = pHVar18->m_internal;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &colorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    imageBarriers_1[0]._64_8_ = pHVar18->m_internal;
    (*(*(_func_int ***)vk_00)[0x69])
              (vk_00,pVVar1,dVar2,1,imageBarriers_1[0]._64_8_,1,1,(int)local_93c);
  }
  region_1.imageExtent.height = 0x2d;
  imageBarriers_1[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarriers_1[0]._4_4_ = 0;
  imageBarriers_1[0].pNext._0_4_ = 0x100;
  if ((caseDef->multisample & 1U) != 0) {
    imageBarriers_1[0].pNext._0_4_ = 0x1000;
  }
  imageBarriers_1[0].pNext._4_4_ = 0x800;
  imageBarriers_1[0].srcAccessMask = 2 - (caseDef->multisample & 1);
  imageBarriers_1[0].dstAccessMask = 6;
  imageBarriers_1[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarriers_1[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &colorImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  imageBarriers_1[0]._32_8_ = pHVar18->m_internal;
  makeColorSubresourceRange
            ((VkImageSubresourceRange *)&imageBarriers_1[0].image,0,caseDef->numLayers);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  (*(*(_func_int ***)vk_00)[0x6d])
            (vk_00,*ppVVar22,0x400,0x1000,0,0,0,0,0,1,&region_1.imageExtent.height);
  local_a00 = 0;
  region_1.bufferOffset._0_4_ = 0;
  region_1.bufferOffset._4_4_ = 0;
  region_1._8_16_ = ::vk::makeImageSubresourceLayers(1,0,0,caseDef->numLayers);
  region_1._24_12_ = ::vk::makeOffset3D(0,0,0);
  region_1._36_12_ = ::vk::makeExtent3D(&caseDef->attachmentSize);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  pVVar1 = *ppVVar22;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &colorImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  dVar2 = pHVar18->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_f8);
  bufferBarriers[0].size = pHVar11->m_internal;
  (*(*(_func_int ***)vk_00)[99])(vk_00,pVVar1,dVar2,6,bufferBarriers[0].size,1,(int)&local_a00);
  local_a68[0] = 0x2c;
  bufferBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarriers[0]._4_4_ = 0;
  bufferBarriers[0].pNext._0_4_ = 0x1000;
  bufferBarriers[0].pNext._4_4_ = 0x2000;
  bufferBarriers[0].srcAccessMask = 0xffffffff;
  bufferBarriers[0].dstAccessMask = 0xffffffff;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_f8);
  bufferBarriers[0]._24_8_ = pHVar11->m_internal;
  bufferBarriers[0].buffer.m_internal = 0;
  bufferBarriers[0].offset = 0xffffffffffffffff;
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar22,0x1000,0x4000,0,0,0,1,(int)local_a68,0,0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  result = (*(*(_func_int ***)vk_00)[0x4a])(vk_00,*ppVVar22);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                    ,0x310);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_460);
  submitCommandsAndWait((DeviceInterface *)vk_00,device_00,queue_00,*ppVVar22);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_148)
  ;
  format = (TextureFormat)::vk::Allocation::getMemory(pAVar15);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_148)
  ;
  VVar17 = ::vk::Allocation::getOffset(pAVar15);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,(VkDeviceMemory)format,VVar17,0xffffffffffffffff);
  TStack_a78 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar5 = tcu::Vector<int,_3>::z(&caseDef->attachmentSize);
  iVar5 = deMax32(iVar5,caseDef->numLayers);
  iVar6 = tcu::Vector<int,_3>::x(&caseDef->attachmentSize);
  iVar7 = tcu::Vector<int,_3>::y(&caseDef->attachmentSize);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data,
             &stack0xfffffffffffff588,iVar6,iVar7,iVar5);
  getExpectedData((PixelBufferAccess *)&resultImage.m_data,
                  (TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data,caseDef);
  iVar6 = tcu::Vector<int,_3>::x(&caseDef->attachmentSize);
  iVar7 = tcu::Vector<int,_3>::y(&caseDef->attachmentSize);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_148)
  ;
  pvVar16 = ::vk::Allocation::getHostPtr(pAVar15);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_af8,&stack0xfffffffffffff588,iVar6,iVar7,iVar5,pvVar16)
  ;
  this_03 = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_03);
  tcu::Vector<unsigned_int,_4>::Vector(&local_b08,1);
  bVar3 = tcu::intThresholdCompare
                    (log,"Image Comparison","",(ConstPixelBufferAccess *)&resultImage.m_data,
                     (ConstPixelBufferAccess *)local_af8,&local_b08,COMPARE_LOG_RESULT);
  bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,"Fail",&local_b29);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_b28);
    std::__cxx11::string::~string((string *)&local_b28);
    std::allocator<char>::~allocator(&local_b29);
  }
  local_b30 = (uint)bVar3;
  tcu::TextureLevel::~TextureLevel
            ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
  if (local_b30 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,"Pass",&local_b51);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_b50);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator(&local_b51);
    local_b30 = 1;
  }
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_460);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_400);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_378);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2f0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
            );
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_270);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           );
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_1f8);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             *)&attachmentHandles.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &colorAttachments.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_148);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_f8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&att_size_y);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &msColorImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	// Color image for rendering in single-sample tests or resolve target for multi-sample tests
	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;

	// For multisampled tests, this is the rendering target
	Move<VkImage>					msColorImage;
	MovePtr<Allocation>				msColorImageAlloc;

	// Host memory buffer where we will copy the rendered image for verification
	const deUint32					att_size_x			= caseDef.attachmentSize.x();
	const deUint32					att_size_y			= caseDef.attachmentSize.y();
	const deUint32					att_size_z			= caseDef.attachmentSize.z();
	const VkDeviceSize				colorBufferSize		= att_size_x * att_size_y * att_size_z * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	vector<SharedPtrVkImageView>	colorAttachments;
	vector<VkImageView>				attachmentHandles;

	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device));
	vector<SharedPtrVkPipeline>		pipeline;
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, COLOR_FORMAT, caseDef.numLayers, caseDef.multisample));
	Move<VkFramebuffer>				framebuffer;

	const Unique<VkShaderModule>	vertexModule		(createShaderModule(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkImageViewType			imageViewType		= caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE || caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
		? VK_IMAGE_VIEW_TYPE_2D : caseDef.imageType;

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genFullQuadVertices(caseDef.numLayers);
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);

		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// create colorImage (and msColorImage) using the configured attachmentsize
	{
		const VkImageUsageFlags	colorImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;

		colorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
			caseDef.attachmentSize, caseDef.numLayers, colorImageUsage, false);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);

		if (caseDef.multisample)
		{
			const VkImageUsageFlags	msImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

			msColorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
				caseDef.attachmentSize, caseDef.numLayers, msImageUsage, true);
			msColorImageAlloc	= bindImage(vk, device, allocator, *msColorImage, MemoryRequirement::Any);
		}
	}

	// create attachmentHandles and pipelines (one for each layer). We use the renderSize for viewport and scissor
	for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
	{
		colorAttachments.push_back(makeSharedPtr(makeImageView(vk, device, ! caseDef.multisample ? *colorImage : *msColorImage,
			imageViewType, COLOR_FORMAT, makeColorSubresourceRange(layerNdx, 1))));
		attachmentHandles.push_back(**colorAttachments.back());

		pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
			caseDef.renderSize, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, layerNdx, true, caseDef.multisample)));
	}

	// create framebuffer
	framebuffer = makeFramebuffer(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
		static_cast<deUint32>(caseDef.renderSize.x()), static_cast<deUint32>(caseDef.renderSize.y()));

	// record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// Clear the entire image attachment to black
		{
			const VkImageMemoryBarrier	imageLayoutBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					0u,													// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageLayoutBarriers);

			const VkImageSubresourceRange	ranges		= makeColorSubresourceRange(0, caseDef.numLayers);
			const VkClearColorValue			clearColor	=
	        {
                {0.0f, 0.0f, 0.0f, 1.0f}
			};
			vk.cmdClearColorImage(*cmdBuffer, caseDef.multisample ? *msColorImage : *colorImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearColor, 1u, &ranges);

			const VkImageMemoryBarrier	imageClearBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			srcAccessMask;
					VK_ACCESS_COLOR_ATTACHMENT_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,							// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageClearBarriers);
		}

		// Render pass: this should render only to the area defined by renderSize (smaller than the size of the attachment)
		{
			const VkRect2D				renderArea			=
			{
				makeOffset2D(0, 0),
				makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize			vertexBufferOffset	= 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
			{
				vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
				{
					if (layerNdx != 0)
						vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

					vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[layerNdx]);
					vk.cmdDraw(*cmdBuffer, 4u, 1u, layerNdx*4u, 0u);
				}
			}
			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// If we are using a multi-sampled render target (msColorImage), resolve it now (to colorImage)
		if (caseDef.multisample)
		{
			// Transition msColorImage (from layout COLOR_ATTACHMENT_OPTIMAL) and colorImage (from layout UNDEFINED) to layout GENERAL before resolving
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*msColorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				},
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					(VkAccessFlags)0,								// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*colorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 2u, imageBarriers);

			const VkImageResolve	region	=
			{
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    srcSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  srcOffset;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    dstSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  dstOffset;
				makeExtent3D(caseDef.attachmentSize)											// VkExtent3D                  extent;
			};

			vk.cmdResolveImage(*cmdBuffer, *msColorImage, VK_IMAGE_LAYOUT_GENERAL, *colorImage, VK_IMAGE_LAYOUT_GENERAL, 1, &region);
		}

		// copy colorImage to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,														// VkStructureType			sType;
					DE_NULL,																					// const void*				pNext;
					(vk::VkAccessFlags)(caseDef.multisample ? VK_ACCESS_TRANSFER_WRITE_BIT : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),
					VK_ACCESS_TRANSFER_READ_BIT,																// VkAccessFlags			dstAccessMask;
					caseDef.multisample ? VK_IMAGE_LAYOUT_GENERAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,														// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					destQueueFamilyIndex;
					*colorImage,																				// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)												// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, caseDef.numLayers),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.attachmentSize),												// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		const int							depth			= deMax32(caseDef.attachmentSize.z(), caseDef.numLayers);
		tcu::TextureLevel					textureLevel	(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedData(textureLevel, caseDef);
		const tcu::ConstPixelBufferAccess	resultImage		(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}